

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86inst.cpp
# Opt level: O0

uint32_t asmjit::X86Inst::getIdByName(char *name,size_t len)

{
  uint uVar1;
  undefined8 *puVar2;
  ulong in_RSI;
  char *in_RDI;
  int result;
  X86Inst *cur;
  size_t lim;
  X86Inst *end;
  X86Inst *base;
  X86Inst *instData;
  char *nameData;
  uint32_t index;
  uint32_t prefix;
  int c;
  size_t i;
  ulong local_78;
  undefined1 *local_68;
  ulong local_48;
  ulong local_30;
  int local_c;
  
  if (in_RDI != (char *)0x0) {
    local_48 = in_RSI;
    if (in_RSI == 0xffffffffffffffff) {
      local_48 = strlen(in_RDI);
    }
    if (((local_48 != 0 && local_48 < 0x11) && (uVar1 = (int)*in_RDI - 0x61, uVar1 < 0x1a)) &&
       (*(ushort *)(X86InstNameAZ + (ulong)uVar1 * 4) != 0)) {
      local_68 = X86InstDB::instData +
                 (ulong)(uint)*(ushort *)(X86InstNameAZ + (ulong)uVar1 * 4) * 0xc;
      for (local_78 = (long)(X86InstDB::instData +
                            ((long)(int)(uint)*(ushort *)(X86InstNameAZ + (ulong)uVar1 * 4 + 2) *
                             0xc - (long)local_68)) / 0xc; local_78 != 0; local_78 = local_78 >> 1)
      {
        puVar2 = (undefined8 *)(local_68 + (local_78 >> 1) * 0xc);
        uVar1 = (uint)((ulong)*puVar2 >> 8) & 0x3fff;
        for (local_30 = 0; local_30 < local_48; local_30 = local_30 + 1) {
          local_c = (uint)(byte)(&X86InstDB::nameData)[local_30 + uVar1] -
                    (uint)(byte)in_RDI[local_30];
          if (local_c != 0) goto LAB_002400e7;
        }
        local_c = (int)(char)(&X86InstDB::nameData)[local_48 + uVar1];
LAB_002400e7:
        if (local_c < 0) {
          local_68 = (undefined1 *)((long)puVar2 + 0xc);
          local_78 = local_78 - 1;
        }
        else if (local_c < 1) {
          return (uint32_t)((long)(puVar2 + -0x4ae8c) / 0xc);
        }
      }
    }
  }
  return 0;
}

Assistant:

uint32_t X86Inst::getIdByName(const char* name, size_t len) noexcept {
  if (ASMJIT_UNLIKELY(!name))
    return Inst::kIdNone;

  if (len == Globals::kInvalidIndex)
    len = ::strlen(name);

  if (ASMJIT_UNLIKELY(len == 0 || len > kX86InstMaxLength))
    return Inst::kIdNone;

  uint32_t prefix = static_cast<uint32_t>(name[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  uint32_t index = X86InstNameAZ[prefix].start;
  if (ASMJIT_UNLIKELY(!index))
    return Inst::kIdNone;

  const char* nameData = X86InstDB::nameData;
  const X86Inst* instData = X86InstDB::instData;

  const X86Inst* base = instData + index;
  const X86Inst* end  = instData + X86InstNameAZ[prefix].end;

  for (size_t lim = (size_t)(end - base); lim != 0; lim >>= 1) {
    const X86Inst* cur = base + (lim >> 1);
    int result = Utils::cmpInstName(nameData + cur[0].getNameDataIndex(), name, len);

    if (result < 0) {
      base = cur + 1;
      lim--;
      continue;
    }

    if (result > 0)
      continue;

    return static_cast<uint32_t>((size_t)(cur - instData));
  }

  return Inst::kIdNone;
}